

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

Vec4 __thiscall
vkt::api::anon_unknown_0::getFormatThreshold(anon_unknown_0 *this,TextureFormat *format)

{
  int iVar1;
  float x_;
  float y_;
  float z_;
  float w_;
  undefined8 extraout_XMM0_Qa;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar2;
  Vec4 VVar3;
  Vector<float,_4> local_88;
  undefined1 local_78 [8];
  IVec4 bits;
  float local_60 [2];
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined1 local_28 [8];
  Vec4 threshold;
  TextureFormat *format_local;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  
  threshold.m_data._8_8_ = format;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_28,0.01);
  switch(*(undefined4 *)(threshold.m_data._8_8_ + 4)) {
  case 0x16:
    in_XMM1_Qa = 0x3ca3d70a;
    tcu::Vector<float,_4>::Vector(&local_58,0.02,0.02,0.0625,1.0);
    local_28._0_4_ = local_58.m_data[0];
    local_28._4_4_ = local_58.m_data[1];
    threshold.m_data[0] = local_58.m_data[2];
    threshold.m_data[1] = local_58.m_data[3];
    break;
  case 0x17:
    in_XMM1_Qa = 0x3d4ccccd;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(bits.m_data + 2),0.05,0.05,0.05,1.0);
    local_28._0_4_ = bits.m_data[2];
    local_28._4_4_ = bits.m_data[3];
    threshold.m_data._0_8_ = local_60;
    break;
  default:
    tcu::getTextureFormatMantissaBitDepth((tcu *)local_78,(TextureFormat *)threshold.m_data._8_8_);
    iVar1 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_78);
    x_ = calculateFloatConversionError(iVar1);
    iVar1 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_78);
    y_ = calculateFloatConversionError(iVar1);
    iVar1 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_78);
    z_ = calculateFloatConversionError(iVar1);
    iVar1 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_78);
    w_ = calculateFloatConversionError(iVar1);
    in_XMM1_Qa = (ulong)(uint)y_;
    tcu::Vector<float,_4>::Vector(&local_88,x_,y_,z_,w_);
    local_28._0_4_ = local_88.m_data[0];
    local_28._4_4_ = local_88.m_data[1];
    threshold.m_data[0] = local_88.m_data[2];
    threshold.m_data[1] = local_88.m_data[3];
    break;
  case 0x22:
    tcu::Vector<float,_4>::Vector(&local_38,0.005);
    local_28._0_4_ = local_38.m_data[0];
    local_28._4_4_ = local_38.m_data[1];
    threshold.m_data[0] = local_38.m_data[2];
    threshold.m_data[1] = local_38.m_data[3];
    break;
  case 0x23:
  case 0x24:
    tcu::Vector<float,_4>::Vector(&local_48,0.001);
    local_28._0_4_ = local_48.m_data[0];
    local_28._4_4_ = local_48.m_data[1];
    threshold.m_data[0] = local_48.m_data[2];
    threshold.m_data[1] = local_48.m_data[3];
  }
  if ((*(int *)threshold.m_data._8_8_ == 10) || (*(int *)threshold.m_data._8_8_ == 0xb)) {
    VVar2 = tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)this,(int)local_28,2,1,0);
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,(Vector<float,_4> *)local_28);
    VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar2.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
    VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar3.m_data[0] = VVar2.m_data[0];
  auVar4._4_4_ = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  register0x00001244 = VVar2.m_data[3];
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 getFormatThreshold (const tcu::TextureFormat& format)
{
	tcu::Vec4 threshold(0.01f);

	switch (format.type)
	{
	case tcu::TextureFormat::HALF_FLOAT:
		threshold = tcu::Vec4(0.005f);
		break;

	case tcu::TextureFormat::FLOAT:
	case tcu::TextureFormat::FLOAT64:
		threshold = tcu::Vec4(0.001f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
		threshold = tcu::Vec4(0.02f, 0.02f, 0.0625f, 1.0f);
		break;

	case tcu::TextureFormat::UNSIGNED_INT_999_E5_REV:
		threshold = tcu::Vec4(0.05f, 0.05f, 0.05f, 1.0f);
		break;

	default:
		const tcu::IVec4 bits = tcu::getTextureFormatMantissaBitDepth(format);
		threshold = tcu::Vec4(calculateFloatConversionError(bits.x()),
				      calculateFloatConversionError(bits.y()),
				      calculateFloatConversionError(bits.z()),
				      calculateFloatConversionError(bits.w()));
	}

	// Return value matching the channel order specified by the format
	if (format.order == tcu::TextureFormat::BGR || format.order == tcu::TextureFormat::BGRA)
		return threshold.swizzle(2, 1, 0, 3);
	else
		return threshold;
}